

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

Cacheblock<4U>_conflict *
med3char<Cacheblock<4u>,Cmp>
          (Cacheblock<4U>_conflict *a,Cacheblock<4U>_conflict *b,Cacheblock<4U>_conflict *c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Cacheblock<4U>_conflict *pCVar4;
  
  uVar1 = a->cached_bytes;
  uVar2 = b->cached_bytes;
  pCVar4 = a;
  if (((uVar1 != uVar2) && (uVar3 = c->cached_bytes, pCVar4 = c, uVar3 != uVar1)) &&
     (uVar3 != uVar2)) {
    if (uVar1 < uVar2) {
      if (uVar1 < uVar3) {
        a = c;
      }
      if (uVar2 < uVar3) {
        a = b;
      }
      return a;
    }
    if (uVar1 < uVar3) {
      c = a;
    }
    pCVar4 = c;
    if (uVar3 < uVar2) {
      pCVar4 = b;
    }
  }
  return pCVar4;
}

Assistant:

CharT&
med3char(CharT& a, CharT& b, CharT& c, Cmp cmp)
{
	if (cmp(a, b) == 0)                   return a;
	if (cmp(c, a) == 0 or cmp(c, b) == 0) return c;
	if (cmp(a, b) < 0) {
		if (cmp(b, c) < 0) return b;
		if (cmp(a, c) < 0) return c;
		return a;
	}
	if (cmp(b, c) > 0) return b;
	if (cmp(a, c) < 0) return a;
	return c;
}